

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O2

bool __thiscall wasm::LazyLocalGraph::isSSA(LazyLocalGraph *this,Index index)

{
  undefined1 uVar1;
  iterator iVar2;
  size_type sVar3;
  Index local_24 [2];
  Index index_local;
  
  local_24[0] = index;
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->SSAIndexes)._M_h,local_24);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>._M_cur ==
      (__node_type *)0x0) {
    uVar1 = computeSSA(this,local_24[0]);
    sVar3 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&(this->SSAIndexes)._M_h,local_24);
    if (sVar3 == 0) {
      __assert_fail("SSAIndexes.count(index)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/local-graph.h"
                    ,0xdd,"bool wasm::LazyLocalGraph::isSSA(Index) const");
    }
  }
  else {
    uVar1 = *(undefined1 *)
             ((long)iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>.
                    _M_cur + 0xc);
  }
  return (bool)uVar1;
}

Assistant:

bool isSSA(Index index) const {
    auto iter = SSAIndexes.find(index);
    if (iter == SSAIndexes.end()) {
      auto ret = computeSSA(index);
      // The result must have been memoized.
      assert(SSAIndexes.count(index));
      return ret;
    }
    return iter->second;
  }